

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cc
# Opt level: O3

void __thiscall tchecker::clockbounds::df_solver_t::~df_solver_t(df_solver_t *this)

{
  pointer puVar1;
  
  if (this->_L != (db_t *)0x0) {
    operator_delete__(this->_L);
  }
  if (this->_U != (db_t *)0x0) {
    operator_delete__(this->_U);
  }
  puVar1 = (this->_loc_pid).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (puVar1 != (pointer)0x0) {
    operator_delete(puVar1,(long)(this->_loc_pid).
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar1);
    return;
  }
  return;
}

Assistant:

df_solver_t::~df_solver_t()
{
  delete[] _L;
  delete[] _U;
}